

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves.cpp
# Opt level: O1

void __thiscall linkedMoveList::deleteList(linkedMoveList *this)

{
  moveNode *pmVar1;
  moveNode *pmVar2;
  
  pmVar2 = this->head;
  while (pmVar2 != (moveNode *)0x0) {
    pmVar1 = pmVar2->next;
    operator_delete(pmVar2,0x10);
    pmVar2 = pmVar1;
  }
  this->head = (moveNode *)0x0;
  this->tail = (moveNode *)0x0;
  return;
}

Assistant:

void linkedMoveList::deleteList(){
  moveNode *cur;
  moveNode *temp;
  cur = head;
	temp = head;
	while(temp != NULL){
    temp = cur->next;
		delete cur;
    cur = temp;
	}

  head = NULL;
  tail = NULL;
}